

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkRestrashZero(Abc_Ntk_t *pNtk,int fCleanup)

{
  ulong *puVar1;
  uint *puVar2;
  Abc_Aig_t *pMan;
  int iVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *p1;
  char *pName;
  Abc_Ntk_t *pAVar7;
  uint uVar8;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar3 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar3 != 0) {
      puts("Warning: The choice nodes in the original AIG are removed by strashing.");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    uVar8 = 0;
    for (iVar3 = 0; iVar3 < pNtk->vBoxes->nSize; iVar3 = iVar3 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar3);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        if ((pAVar5->field_5).pData == (void *)0x3) {
          uVar8 = uVar8 + 1;
        }
        else {
          iVar4 = Abc_LatchIsInit1(pAVar5);
          if (iVar4 != 0) {
            puVar1 = (ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40)
            ;
            *puVar1 = *puVar1 ^ 1;
          }
        }
      }
    }
    if (uVar8 != 0) {
      printf("Converting %d flops from don\'t-care to zero initial value.\n",(ulong)uVar8);
    }
    for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar5 = Abc_NtkObj(pNtk,iVar3);
      if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
        pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
        pAVar6 = Abc_ObjChild0Copy(pAVar5);
        p1 = Abc_ObjChild1Copy(pAVar5);
        pAVar6 = Abc_AigAnd(pMan,pAVar6,p1);
        (pAVar5->field_6).pCopy = pAVar6;
      }
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    for (iVar3 = 0; iVar4 = pNtkNew->vBoxes->nSize, iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pAVar5 = Abc_NtkBox(pNtkNew,iVar3);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        iVar4 = Abc_LatchIsInit1(pAVar5);
        if (iVar4 != 0) {
          puVar2 = (uint *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x14);
          *puVar2 = *puVar2 ^ 0x400;
          pAVar6 = Abc_NodeFindCoFanout
                             ((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
          if (pAVar6 != (Abc_Obj_t *)0x0) {
            Nm_ManDeleteIdName(pAVar5->pNtk->pManName,
                               *(int *)((long)pAVar5->pNtk->vObjs->pArray
                                              [*(pAVar5->vFanouts).pArray] + 0x10));
            pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
            pName = Abc_ObjName(pAVar5);
            Abc_ObjAssignName(pAVar5,pName,"_inv");
          }
        }
      }
    }
    for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pAVar5 = Abc_NtkBox(pNtkNew,iVar3);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        pAVar5->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      }
      iVar4 = pNtkNew->vBoxes->nSize;
    }
    if (fCleanup != 0) {
      uVar8 = Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
      if (uVar8 != 0) {
        printf("Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n",(ulong)uVar8);
      }
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar7 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar7;
    }
    if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
      Abc_NtkTransferNameIds(pNtk,pNtkNew);
      if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
        Abc_NtkUpdateNameIds(pNtkNew);
      }
    }
    iVar3 = Abc_NtkCheck(pNtkNew);
    if (iVar3 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0xbc,"Abc_Ntk_t *Abc_NtkRestrashZero(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashZero( Abc_Ntk_t * pNtk, int fCleanup )
{
//    extern int timeRetime;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    int Counter = 0;
    assert( Abc_NtkIsStrash(pNtk) );
//timeRetime = Abc_Clock();
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // complement the 1-values registers
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        if ( Abc_LatchIsInitDc(pObj) )
            Counter++;
        else if ( Abc_LatchIsInit1(pObj) )
            Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    if ( Counter )
    printf( "Converting %d flops from don't-care to zero initial value.\n", Counter );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // complement the 1-valued registers
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        if ( Abc_LatchIsInit1(pObj) )
        {
            Abc_ObjXorFaninC( Abc_ObjFanin0(pObj), 0 );
            // if latch has PO as one of its fanouts change latch name
            if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pObj) ) )
            {
                Nm_ManDeleteIdName( pObj->pNtk->pManName, Abc_ObjFanout0(pObj)->Id );
                Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjName(Abc_ObjFanout0(pObj)), "_inv" );
            }
        }
    // set all constant-0 values
    Abc_NtkForEachLatch( pNtkAig, pObj, i )
        Abc_LatchSetInit0( pObj );

    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    if ( fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
        printf( "Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // transfer name IDs
    if ( pNtk->vNameIds )
        Abc_NtkTransferNameIds( pNtk, pNtkAig );
    if ( pNtk->vNameIds )
        Abc_NtkUpdateNameIds( pNtkAig );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//timeRetime = Abc_Clock() - timeRetime;
//    if ( RetValue = Abc_NtkRemoveSelfFeedLatches(pNtkAig) )
//        printf( "Modified %d self-feeding latches. The result may not verify.\n", RetValue );
    return pNtkAig;

}